

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

tmbstr CreatePropString(TidyDocImpl *doc,StyleProp *props)

{
  char cVar1;
  tmbstr ptVar2;
  uint uVar3;
  tmbstr ptVar4;
  StyleProp *local_40;
  StyleProp *prop;
  char *pcStack_30;
  uint len;
  tmbstr s;
  tmbstr p;
  tmbstr style;
  StyleProp *props_local;
  TidyDocImpl *doc_local;
  
  prop._4_4_ = 0;
  for (local_40 = props; local_40 != (StyleProp *)0x0; local_40 = local_40->next) {
    uVar3 = prvTidytmbstrlen(local_40->name);
    prop._4_4_ = uVar3 + 2 + prop._4_4_;
    if (local_40->value != (tmbstr)0x0) {
      uVar3 = prvTidytmbstrlen(local_40->value);
      prop._4_4_ = uVar3 + 2 + prop._4_4_;
    }
  }
  ptVar4 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,(long)prop._4_4_ + 1);
  *ptVar4 = '\0';
  local_40 = props;
  s = ptVar4;
  while( true ) {
    if (local_40 == (StyleProp *)0x0) {
      return ptVar4;
    }
    pcStack_30 = local_40->name;
    ptVar2 = s;
    do {
      s = ptVar2;
      cVar1 = *pcStack_30;
      *s = cVar1;
      pcStack_30 = pcStack_30 + 1;
      ptVar2 = s + 1;
    } while (cVar1 != '\0');
    if (local_40->value != (tmbstr)0x0) {
      *s = ':';
      s[1] = ' ';
      pcStack_30 = local_40->value;
      s = s + 2;
      do {
        cVar1 = *pcStack_30;
        *s = cVar1;
        pcStack_30 = pcStack_30 + 1;
        ptVar2 = s + 1;
        s = s + 1;
      } while (cVar1 != '\0');
    }
    s = ptVar2;
    if (local_40->next == (StyleProp *)0x0) break;
    s[-1] = ';';
    *s = ' ';
    s = s + 1;
    local_40 = local_40->next;
  }
  return ptVar4;
}

Assistant:

static tmbstr CreatePropString(TidyDocImpl* doc, StyleProp *props)
{
    tmbstr style, p, s;
    uint len;
    StyleProp *prop;

    /* compute length */

    for (len = 0, prop = props; prop; prop = prop->next)
    {
        len += TY_(tmbstrlen)(prop->name) + 2;
        if (prop->value)
            len += TY_(tmbstrlen)(prop->value) + 2;
    }

    style = (tmbstr) TidyDocAlloc(doc, len+1);
    style[0] = '\0';

    for (p = style, prop = props; prop; prop = prop->next)
    {
        s = prop->name;

        while((*p++ = *s++))
            continue;

        if (prop->value)
        {
            *--p = ':';
            *++p = ' ';
            ++p;

            s = prop->value;
            while((*p++ = *s++))
                continue;
        }
        if (prop->next == NULL)
            break;

        *--p = ';';
        *++p = ' ';
        ++p;
    }

    return style;
}